

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  pointer pcVar1;
  pointer pcVar2;
  cmLinkInterface *pcVar3;
  pointer __v;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar4;
  cmLinkItem local_68;
  
  pcVar3 = cmGeneratorTarget::GetLinkInterface
                     (dependee,config,
                      (this->Targets).
                      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[depender_index]);
  if (pcVar3 != (cmLinkInterface *)0x0) {
    __v = (pcVar3->super_cmLinkInterfaceLibraries).Libraries.
          super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_start;
    pcVar1 = (pcVar3->super_cmLinkInterfaceLibraries).Libraries.
             super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__v != pcVar1) {
      do {
        pVar4 = std::
                _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                ::_M_insert_unique<cmLinkItem_const&>
                          ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                            *)emitted,__v);
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_68.String._M_dataplus._M_p = (pointer)&local_68.String.field_2;
          pcVar2 = (__v->String)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar2,pcVar2 + (__v->String)._M_string_length);
          local_68.Target = __v->Target;
          local_68.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (__v->Backtrace).TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_68.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.Backtrace.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.Backtrace.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_68.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (dependee_backtrace->TopEntry).
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_68.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     &(dependee_backtrace->TopEntry).
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          AddTargetDepend(this,depender_index,&local_68,true);
          AddInterfaceDepends(this,depender_index,&local_68,config,emitted);
          if (local_68.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.String._M_dataplus._M_p != &local_68.String.field_2) {
            operator_delete(local_68.String._M_dataplus._M_p,
                            local_68.String.field_2._M_allocated_capacity + 1);
          }
        }
        __v = __v + 1;
      } while (__v != pcVar1);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, const cmGeneratorTarget* dependee,
  cmListFileBacktrace const& dependee_backtrace, const std::string& config,
  std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (cmLinkInterface const* iface =
        dependee->GetLinkInterface(config, depender)) {
    for (cmLinkItem const& lib : iface->Libraries) {
      // Don't emit the same library twice for this target.
      if (emitted.insert(lib).second) {
        // Inject the backtrace of the original link dependency whose
        // link interface we are adding.  This indicates the line of
        // code in the project that caused this dependency to be added.
        cmLinkItem libBT = lib;
        libBT.Backtrace = dependee_backtrace;
        this->AddTargetDepend(depender_index, libBT, true);
        this->AddInterfaceDepends(depender_index, libBT, config, emitted);
      }
    }
  }
}